

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

JsonParse * jsonParseFuncArg(sqlite3_context *ctx,sqlite3_value *pArg,u32 flgs)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  sqlite3 *db;
  int iVar4;
  int iVar5;
  u32 uVar6;
  u32 uVar7;
  void *__s2;
  AuxData *pAVar8;
  long lVar9;
  sqlite3_context *pCtx;
  JsonParse *pJVar10;
  u8 *puVar11;
  char *pcVar12;
  JsonParse *pJVar13;
  byte bVar14;
  undefined8 *__dest;
  ushort uVar15;
  uint uVar16;
  JsonParse *pParse;
  ulong n;
  long in_FS_OFFSET;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar15 = pArg->flags & 0x3f;
  if ((0xaaaaaaaaaaaaaaaaU >> uVar15 & 1) != 0) {
LAB_001b8cdf:
    pJVar10 = (JsonParse *)0x0;
LAB_001b8ce2:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return pJVar10;
  }
  if (((0x4000000040004U >> uVar15 & 1) != 0) &&
     (__s2 = sqlite3ValueText(pArg,'\x01'), __s2 != (void *)0x0)) {
    iVar4 = sqlite3ValueBytes(pArg,'\x01');
    pAVar8 = ctx->pVdbe->pAuxData;
    if (pAVar8 != (AuxData *)0x0) {
      pParse = (JsonParse *)0x0;
      do {
        if (pAVar8->iAuxArg == -0x68f72) {
          pvVar2 = pAVar8->pAux;
          pParse = (JsonParse *)0x0;
          if (pvVar2 != (void *)0x0) {
            iVar1 = *(int *)((long)pvVar2 + 8);
            pJVar10 = (JsonParse *)(long)iVar1;
            if ((long)pJVar10 < 1) goto LAB_001b89ae;
            pParse = (JsonParse *)0x0;
            goto LAB_001b8955;
          }
          break;
        }
        pAVar8 = pAVar8->pNextAux;
      } while (pAVar8 != (AuxData *)0x0);
      goto LAB_001b8a16;
    }
  }
LAB_001b8a13:
  pParse = (JsonParse *)0x0;
LAB_001b8a16:
  db = ctx->pOut->db;
  pCtx = (sqlite3_context *)0x0;
  if ((flgs & 2) == 0) {
    pCtx = ctx;
  }
  do {
    pJVar10 = (JsonParse *)sqlite3DbMallocZero(db,0x48);
    if (pJVar10 == (JsonParse *)0x0) {
LAB_001b8cc5:
      jsonParseFree(pParse);
      jsonParseFree(pJVar10);
      sqlite3_result_error_nomem(ctx);
      goto LAB_001b8cdf;
    }
    pJVar10->zJson = (char *)0x0;
    pJVar10->db = (sqlite3 *)0x0;
    pJVar10->nJson = 0;
    pJVar10->nJPRef = 0;
    pJVar10->iErr = 0;
    pJVar10->iDepth = 0;
    pJVar10->nErr = '\0';
    pJVar10->oom = '\0';
    pJVar10->bJsonIsRCStr = '\0';
    pJVar10->hasNonstd = '\0';
    pJVar10->bReadOnly = '\0';
    pJVar10->eEdit = '\0';
    pJVar10->delta = 0;
    pJVar10->nIns = 0;
    pJVar10->iLabel = 0;
    pJVar10->aBlob = (u8 *)0x0;
    pJVar10->nBlob = 0;
    pJVar10->nBlobAlloc = 0;
    pJVar10->aIns = (u8 *)0x0;
    pJVar10->db = db;
    pJVar10->nJPRef = 1;
    if (pParse != (JsonParse *)0x0) {
      uVar16 = pParse->nBlob;
      n = (ulong)uVar16;
      if (db == (sqlite3 *)0x0) {
        puVar11 = (u8 *)sqlite3Malloc(n);
      }
      else {
        puVar11 = (u8 *)sqlite3DbMallocRawNN(db,n);
      }
      pJVar10->aBlob = puVar11;
      if (puVar11 == (u8 *)0x0) goto LAB_001b8cc5;
      memcpy(puVar11,pParse->aBlob,n);
      pJVar10->nBlob = uVar16;
      pJVar10->nBlobAlloc = uVar16;
      pJVar10->hasNonstd = pParse->hasNonstd;
      jsonParseFree(pParse);
      goto LAB_001b8ce2;
    }
    if ((0x1000000010001U >> (sbyte)uVar15 & 1) != 0) {
      local_3c = 0;
      puVar11 = (u8 *)sqlite3_value_blob(pArg);
      pJVar10->aBlob = puVar11;
      uVar6 = sqlite3ValueBytes(pArg,'\x01');
      pJVar10->nBlob = uVar6;
      if (uVar6 == 0) {
        pJVar10->aBlob = (u8 *)0x0;
      }
      else if (pJVar10->aBlob != (byte *)0x0) {
        bVar14 = *pJVar10->aBlob & 0xf;
        if ((((bVar14 < 0xd) && (uVar7 = jsonbPayloadSize(pJVar10,0,&local_3c), uVar7 != 0)) &&
            (uVar7 + local_3c == uVar6)) && ((2 < bVar14 || (local_3c == 0)))) {
          if (((flgs & 1) != 0) && (iVar4 = jsonBlobMakeEditable(pJVar10,0), iVar4 == 0))
          goto LAB_001b8cc5;
          goto LAB_001b8ce2;
        }
        pJVar10->aBlob = (u8 *)0x0;
        pJVar10->nBlob = 0;
      }
    }
    pcVar12 = (char *)sqlite3ValueText(pArg,'\x01');
    pJVar10->zJson = pcVar12;
    iVar4 = sqlite3ValueBytes(pArg,'\x01');
    pJVar10->nJson = iVar4;
    if (db->mallocFailed != '\0') goto LAB_001b8cc5;
    if (iVar4 == 0) {
      if ((flgs & 2) == 0) {
        jsonParseFree(pJVar10);
        ctx->isError = 1;
        sqlite3VdbeMemSetStr
                  (ctx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        goto LAB_001b8cdf;
      }
LAB_001b8c6f:
      pJVar10->nErr = '\x01';
      goto LAB_001b8ce2;
    }
    iVar4 = jsonConvertTextToBlob(pJVar10,pCtx);
    if (iVar4 != 0) {
      if ((flgs & 2) != 0) goto LAB_001b8c6f;
      jsonParseFree(pJVar10);
      goto LAB_001b8cdf;
    }
    if (((pArg == (sqlite3_value *)0x0) ||
        ((pArg->flags >> 0xc & 1) == 0 || (pArg->flags & 0x12) == 0)) ||
       (pArg->xDel != sqlite3RCStrUnref)) {
      pcVar12 = sqlite3RCStrNew((long)pJVar10->nJson);
      if (pcVar12 == (char *)0x0) goto LAB_001b8cc5;
      memcpy(pcVar12,pJVar10->zJson,(long)pJVar10->nJson);
      pJVar10->zJson = pcVar12;
      pcVar12[pJVar10->nJson] = '\0';
    }
    else {
      *(long *)(pJVar10->zJson + -8) = *(long *)(pJVar10->zJson + -8) + 1;
    }
    pJVar10->bJsonIsRCStr = '\x01';
    iVar4 = jsonCacheInsert(ctx,pJVar10);
    if (iVar4 == 7) goto LAB_001b8cc5;
    pParse = pJVar10;
    if ((flgs & 1) == 0) goto LAB_001b8ce2;
  } while( true );
  while (pParse = (JsonParse *)((long)&pParse->aBlob + 1), pJVar10 != pParse) {
LAB_001b8955:
    if (*(void **)(*(long *)((long)pvVar2 + (long)pParse * 8 + 0x10) + 0x10) == __s2)
    goto LAB_001b89ae;
  }
  pParse = (JsonParse *)0x0;
  pJVar13 = (JsonParse *)0x0;
LAB_001b8979:
  lVar9 = *(long *)((long)pvVar2 + (long)pJVar13 * 8 + 0x10);
  if ((*(int *)(lVar9 + 0x20) != iVar4) ||
     (iVar5 = bcmp(*(void **)(lVar9 + 0x10),__s2,(long)iVar4), iVar5 != 0)) goto LAB_001b89a1;
  pParse = (JsonParse *)((ulong)pJVar13 & 0xffffffff);
LAB_001b89ae:
  uVar16 = (uint)pParse;
  if (iVar1 <= (int)uVar16) goto LAB_001b8a13;
  if ((int)uVar16 < iVar1 + -1) {
    __dest = (undefined8 *)((long)pvVar2 + ((ulong)pParse & 0xffffffff) * 8 + 0x10);
    uVar3 = *__dest;
    memmove(__dest,(void *)((long)pvVar2 + ((ulong)pParse & 0xffffffff) * 8 + 0x18),
            (long)(int)(~uVar16 + iVar1) << 3);
    iVar4 = *(int *)((long)pvVar2 + 8);
    *(undefined8 *)((long)pvVar2 + (long)iVar4 * 8 + 8) = uVar3;
    lVar9 = (long)iVar4 + -1;
  }
  else {
    lVar9 = (long)(int)uVar16;
  }
  pParse = *(JsonParse **)((long)pvVar2 + lVar9 * 8 + 0x10);
  if (pParse == (JsonParse *)0x0) goto LAB_001b8a13;
  pParse->nJPRef = pParse->nJPRef + 1;
  pJVar10 = pParse;
  if ((flgs & 1) == 0) goto LAB_001b8ce2;
  goto LAB_001b8a16;
LAB_001b89a1:
  pJVar13 = (JsonParse *)((long)&pJVar13->aBlob + 1);
  if (pJVar10 == pJVar13) goto LAB_001b8a16;
  goto LAB_001b8979;
}

Assistant:

static JsonParse *jsonParseFuncArg(
  sqlite3_context *ctx,
  sqlite3_value *pArg,
  u32 flgs
){
  int eType;                   /* Datatype of pArg */
  JsonParse *p = 0;            /* Value to be returned */
  JsonParse *pFromCache = 0;   /* Value taken from cache */
  sqlite3 *db;                 /* The database connection */

  assert( ctx!=0 );
  eType = sqlite3_value_type(pArg);
  if( eType==SQLITE_NULL ){
    return 0;
  }
  pFromCache = jsonCacheSearch(ctx, pArg);
  if( pFromCache ){
    pFromCache->nJPRef++;
    if( (flgs & JSON_EDITABLE)==0 ){
      return pFromCache;
    }
  }
  db = sqlite3_context_db_handle(ctx);
rebuild_from_cache:
  p = sqlite3DbMallocZero(db, sizeof(*p));
  if( p==0 ) goto json_pfa_oom;
  memset(p, 0, sizeof(*p));
  p->db = db;
  p->nJPRef = 1;
  if( pFromCache!=0 ){
    u32 nBlob = pFromCache->nBlob;
    p->aBlob = sqlite3DbMallocRaw(db, nBlob);
    if( p->aBlob==0 ) goto json_pfa_oom;
    memcpy(p->aBlob, pFromCache->aBlob, nBlob);
    p->nBlobAlloc = p->nBlob = nBlob;
    p->hasNonstd = pFromCache->hasNonstd;
    jsonParseFree(pFromCache);
    return p;
  }
  if( eType==SQLITE_BLOB ){
    if( jsonArgIsJsonb(pArg,p) ){
      if( (flgs & JSON_EDITABLE)!=0 && jsonBlobMakeEditable(p, 0)==0 ){
        goto json_pfa_oom;
      }
      return p;
    }
    /* If the blob is not valid JSONB, fall through into trying to cast
    ** the blob into text which is then interpreted as JSON.  (tag-20240123-a)
    **
    ** This goes against all historical documentation about how the SQLite
    ** JSON functions were suppose to work.  From the beginning, blob was
    ** reserved for expansion and a blob value should have raised an error.
    ** But it did not, due to a bug.  And many applications came to depend
    ** upon this buggy behavior, espeically when using the CLI and reading
    ** JSON text using readfile(), which returns a blob.  For this reason
    ** we will continue to support the bug moving forward.
    ** See for example https://sqlite.org/forum/forumpost/012136abd5292b8d
    */
  }
  p->zJson = (char*)sqlite3_value_text(pArg);
  p->nJson = sqlite3_value_bytes(pArg);
  if( db->mallocFailed ) goto json_pfa_oom;
  if( p->nJson==0 ) goto json_pfa_malformed;
  assert( p->zJson!=0 );
  if( jsonConvertTextToBlob(p, (flgs & JSON_KEEPERROR) ? 0 : ctx) ){
    if( flgs & JSON_KEEPERROR ){
      p->nErr = 1;
      return p;
    }else{
      jsonParseFree(p);
      return 0;
    }
  }else{
    int isRCStr = sqlite3ValueIsOfClass(pArg, sqlite3RCStrUnref);
    int rc;
    if( !isRCStr ){
      char *zNew = sqlite3RCStrNew( p->nJson );
      if( zNew==0 ) goto json_pfa_oom;
      memcpy(zNew, p->zJson, p->nJson);
      p->zJson = zNew;
      p->zJson[p->nJson] = 0;
    }else{
      sqlite3RCStrRef(p->zJson);
    }
    p->bJsonIsRCStr = 1;
    rc = jsonCacheInsert(ctx, p);
    if( rc==SQLITE_NOMEM ) goto json_pfa_oom;
    if( flgs & JSON_EDITABLE ){
      pFromCache = p;
      p = 0;
      goto rebuild_from_cache;
    }
  }
  return p;

json_pfa_malformed:
  if( flgs & JSON_KEEPERROR ){
    p->nErr = 1;
    return p;
  }else{
    jsonParseFree(p);
    sqlite3_result_error(ctx, "malformed JSON", -1);
    return 0;
  }

json_pfa_oom:
  jsonParseFree(pFromCache);
  jsonParseFree(p);
  sqlite3_result_error_nomem(ctx);
  return 0;
}